

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_find_best_sub_pixel_tree_pruned
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  byte bVar1;
  short sVar2;
  int iVar3;
  int *piVar4;
  ushort uVar5;
  ushort uVar6;
  short sVar7;
  int is_scaled;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  short sVar14;
  int iVar15;
  MV *pMVar16;
  short sVar17;
  scale_factors *sf;
  short sVar18;
  SubpelMvLimits *mv_limits;
  short sVar19;
  uint local_d8;
  MV left_mv;
  int dummy;
  MV right_mv;
  MV top_mv;
  MV bottom_right_mv;
  MV bottom_mv;
  int dummy_2;
  MV top_right_mv;
  MV top_left_mv;
  
  iVar13 = ms_params->allow_hp;
  bVar1 = ms_params->forced_stop;
  iVar3 = ms_params->iters_per_step;
  piVar4 = ms_params->cost_list;
  *bestmv = start_mv;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    sf = xd->block_ref_scale_factors[0];
  }
  else {
    sf = &cm->sf_identity;
  }
  mv_cost_params = &ms_params->mv_cost_params;
  var_params = &ms_params->var_params;
  is_scaled = av1_is_scaled(sf);
  if (is_scaled == 0 && start_mv_stats != (FULLPEL_MV_STATS *)0x0) {
    local_d8 = start_mv_stats->err_cost + start_mv_stats->distortion;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  }
  else {
    local_d8 = setup_center_error_facade
                         (xd,cm,bestmv,var_params,mv_cost_params,sse1,distortion,is_scaled);
  }
  if (bVar1 == 3) {
    return local_d8;
  }
  iVar8 = check_repeated_mv_and_update(last_mv_search_list,*bestmv,0);
  if (iVar8 != 0) {
    return 0x7fffffff;
  }
  sVar2 = start_mv.col;
  mv_limits = &ms_params->mv_limits;
  sVar19 = start_mv.row;
  top_mv.col = sVar2;
  if ((((piVar4 != (int *)0x0) && (*piVar4 != 0x7fffffff)) && (piVar4[1] != 0x7fffffff)) &&
     (((piVar4[2] != 0x7fffffff && (piVar4[3] != 0x7fffffff)) && (piVar4[4] != 0x7fffffff)))) {
    bottom_mv.col = sVar2 + -4;
    left_mv.col = bottom_mv.col;
    left_mv.row = sVar19;
    bottom_right_mv.col = sVar2 + 4;
    dummy = CONCAT22(bottom_right_mv.col,sVar19);
    right_mv.row = sVar19 + 4;
    top_mv.row = sVar19 + -4;
    right_mv.col = sVar2;
    bottom_right_mv.row = right_mv.row;
    bottom_mv.row = right_mv.row;
    iVar13 = (*(code *)(&DAT_004477ac +
                       *(int *)(&DAT_004477ac +
                               (ulong)((uint)(piVar4[3] <= piVar4[1]) +
                                      (uint)(piVar4[4] <= piVar4[2]) * 2) * 4)))();
    return iVar13;
  }
  iVar8 = (int)start_mv >> 0x10;
  left_mv.col = sVar2 + -4;
  left_mv.row = sVar19;
  dummy = 0;
  uVar9 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                            ,distortion,&dummy,is_scaled);
  right_mv.col = sVar2 + 4;
  right_mv.row = sVar19;
  uVar10 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                             sse1,distortion,&dummy,is_scaled);
  top_mv.row = sVar19 + -4;
  uVar11 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                             ,distortion,&dummy,is_scaled);
  bottom_mv.row = sVar19 + 4;
  bottom_mv.col = sVar2;
  uVar12 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                             sse1,distortion,&dummy,is_scaled);
  sVar7 = -4;
  if (uVar12 < uVar11) {
    sVar7 = 4;
  }
  sVar14 = -4;
  if (uVar10 < uVar9) {
    sVar14 = 4;
  }
  bottom_right_mv.row = sVar7 + sVar19;
  bottom_right_mv.col = sVar14 + sVar2;
  check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                    ,distortion,&dummy,is_scaled);
  if (1 < iVar3) {
    sVar2 = bestmv->row;
    sVar17 = bestmv->col;
    iVar15 = (int)sVar17;
    left_mv.row = 0;
    left_mv.col = 0;
    if (iVar8 == iVar15 || sVar19 == sVar2) {
      if (sVar19 == sVar2 && iVar8 != iVar15) {
        right_mv.col = sVar17 + sVar14;
        dummy = CONCAT22(right_mv.col,sVar2 + 4);
        right_mv.row = sVar2 + -4;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        top_mv.row = sVar2 - sVar7;
        pMVar16 = &top_mv;
        top_mv.col = sVar17;
      }
      else {
        if (sVar19 == sVar2 || iVar8 != iVar15) goto LAB_002a5b66;
        right_mv.row = sVar7 + sVar2;
        dummy = CONCAT22(sVar17 + 4,right_mv.row);
        right_mv.col = sVar17 + -4;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        pMVar16 = &top_mv;
        top_mv.row = sVar2;
        top_mv.col = sVar17 - sVar14;
      }
    }
    else {
      dummy = CONCAT22(sVar17 + sVar14,sVar2);
      right_mv.row = sVar2 + sVar7;
      right_mv.col = sVar17;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                        ,distortion,(int *)&left_mv,is_scaled);
      pMVar16 = &right_mv;
    }
    check_better_fast(xd,cm,pMVar16,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                      distortion,(int *)&left_mv,is_scaled);
  }
LAB_002a5b66:
  if (1 < bVar1) {
    return local_d8;
  }
  iVar8 = check_repeated_mv_and_update(last_mv_search_list,*bestmv,1);
  if (iVar8 != 0) {
    return 0x7fffffff;
  }
  sVar2 = bestmv->row;
  sVar19 = bestmv->col;
  left_mv.col = sVar19 + -2;
  left_mv.row = sVar2;
  dummy = 0;
  uVar9 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                            ,distortion,&dummy,is_scaled);
  right_mv.row = sVar2;
  right_mv.col = sVar19 + 2;
  uVar10 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                             sse1,distortion,&dummy,is_scaled);
  top_mv.row = sVar2 + -2;
  top_mv.col = sVar19;
  uVar11 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                             ,distortion,&dummy,is_scaled);
  bottom_mv.row = sVar2 + 2;
  bottom_mv.col = sVar19;
  uVar12 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                             sse1,distortion,&dummy,is_scaled);
  bottom_right_mv.row = sVar2 + (ushort)(uVar12 < uVar11) * 4 + -2;
  bottom_right_mv.col = sVar19 + -2 + (ushort)(uVar10 < uVar9) * 4;
  check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                    ,distortion,&dummy,is_scaled);
  if (1 < iVar3) {
    sVar17 = (ushort)(uVar12 < uVar11) * 4 + -2;
    sVar18 = (ushort)(uVar10 < uVar9) * 4 + -2;
    sVar7 = bestmv->row;
    sVar14 = bestmv->col;
    left_mv.row = 0;
    left_mv.col = 0;
    if (sVar19 == sVar14 || sVar2 == sVar7) {
      if (sVar2 == sVar7 && sVar19 != sVar14) {
        right_mv.col = sVar18 + sVar14;
        dummy = CONCAT22(right_mv.col,sVar2 + 2);
        right_mv.row = sVar2 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        top_mv.row = sVar2 - sVar17;
        pMVar16 = &top_mv;
        top_mv.col = sVar14;
      }
      else {
        if (sVar2 == sVar7 || sVar19 != sVar14) goto LAB_002a60e6;
        right_mv.row = sVar17 + sVar7;
        dummy = CONCAT22(sVar19 + 2,right_mv.row);
        right_mv.col = sVar19 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        pMVar16 = &top_mv;
        top_mv.row = sVar7;
        top_mv.col = sVar19 - sVar18;
      }
    }
    else {
      dummy = CONCAT22(sVar18 + sVar14,sVar7);
      right_mv.row = sVar17 + sVar7;
      right_mv.col = sVar14;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                        ,distortion,(int *)&left_mv,is_scaled);
      pMVar16 = &right_mv;
    }
    check_better_fast(xd,cm,pMVar16,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                      distortion,(int *)&left_mv,is_scaled);
  }
LAB_002a60e6:
  uVar9 = local_d8;
  if (bVar1 == 0 && iVar13 != 0) {
    iVar13 = check_repeated_mv_and_update(last_mv_search_list,*bestmv,2);
    uVar9 = 0x7fffffff;
    if (iVar13 == 0) {
      sVar2 = bestmv->row;
      sVar19 = bestmv->col;
      left_mv.col = sVar19 + -1;
      left_mv.row = sVar2;
      dummy = 0;
      uVar9 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                                sse1,distortion,&dummy,is_scaled);
      right_mv.row = sVar2;
      right_mv.col = sVar19 + 1;
      uVar10 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                 &local_d8,sse1,distortion,&dummy,is_scaled);
      top_mv.row = sVar2 + -1;
      top_mv.col = sVar19;
      uVar11 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                                 sse1,distortion,&dummy,is_scaled);
      bottom_mv.row = sVar2 + 1;
      bottom_mv.col = sVar19;
      uVar12 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                 &local_d8,sse1,distortion,&dummy,is_scaled);
      uVar5 = (uVar12 < uVar11) - 1 | 1;
      bottom_right_mv.row = sVar2 + uVar5;
      uVar6 = (uVar10 < uVar9) - 1 | 1;
      bottom_right_mv.col = sVar19 + uVar6;
      check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                        sse1,distortion,&dummy,is_scaled);
      uVar9 = local_d8;
      if (1 < iVar3) {
        sVar7 = bestmv->row;
        sVar14 = bestmv->col;
        left_mv.row = 0;
        left_mv.col = 0;
        if (sVar19 == sVar14 || sVar2 == sVar7) {
          if (sVar2 == sVar7 && sVar19 != sVar14) {
            right_mv.col = sVar14 + uVar6;
            dummy = CONCAT22(right_mv.col,sVar2 + 1);
            right_mv.row = sVar2 + -1;
            check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,
                              &local_d8,sse1,distortion,(int *)&left_mv,is_scaled);
            check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,(int *)&left_mv,is_scaled);
            top_mv.row = sVar2 - uVar5;
            pMVar16 = &top_mv;
            top_mv.col = sVar14;
          }
          else {
            if (sVar2 == sVar7 || sVar19 != sVar14) {
              return local_d8;
            }
            right_mv.row = uVar5 + sVar7;
            dummy = CONCAT22(sVar19 + 1,right_mv.row);
            right_mv.col = sVar19 + -1;
            check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,
                              &local_d8,sse1,distortion,(int *)&left_mv,is_scaled);
            check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,(int *)&left_mv,is_scaled);
            pMVar16 = &top_mv;
            top_mv.row = sVar7;
            top_mv.col = sVar19 - uVar6;
          }
        }
        else {
          dummy = CONCAT22(sVar14 + uVar6,sVar7);
          right_mv.row = uVar5 + sVar7;
          right_mv.col = sVar14;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,is_scaled);
          pMVar16 = &right_mv;
        }
        check_better_fast(xd,cm,pMVar16,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        uVar9 = local_d8;
      }
    }
  }
  return uVar9;
}

Assistant:

int av1_find_best_sub_pixel_tree_pruned(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)cm;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const int *cost_list = ms_params->cost_list;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;

  // The iteration we are current searching for. Iter 0 corresponds to fullpel
  // mv, iter 1 to half pel, and so on
  int iter = 0;
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel
  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    besterr =
        setup_center_error_facade(xd, cm, bestmv, var_params, mv_cost_params,
                                  sse1, distortion, is_scaled);
  }

  // If forced_stop is FULL_PEL, return.
  if (forced_stop == FULL_PEL) return besterr;

  if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
    return INT_MAX;
  }
  iter++;

  if (cost_list && cost_list[0] != INT_MAX && cost_list[1] != INT_MAX &&
      cost_list[2] != INT_MAX && cost_list[3] != INT_MAX &&
      cost_list[4] != INT_MAX) {
    const unsigned int whichdir = (cost_list[1] < cost_list[3] ? 0 : 1) +
                                  (cost_list[2] < cost_list[4] ? 0 : 2);

    const MV left_mv = { start_mv.row, start_mv.col - hstep };
    const MV right_mv = { start_mv.row, start_mv.col + hstep };
    const MV bottom_mv = { start_mv.row + hstep, start_mv.col };
    const MV top_mv = { start_mv.row - hstep, start_mv.col };

    const MV bottom_left_mv = { start_mv.row + hstep, start_mv.col - hstep };
    const MV bottom_right_mv = { start_mv.row + hstep, start_mv.col + hstep };
    const MV top_left_mv = { start_mv.row - hstep, start_mv.col - hstep };
    const MV top_right_mv = { start_mv.row - hstep, start_mv.col + hstep };

    int dummy = 0;

    switch (whichdir) {
      case 0:  // bottom left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_left_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 1:  // bottom right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_right_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 2:  // top left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
      case 3:  // top right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
    }
  } else {
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  // Each subsequent iteration checks at least one point in common with
  // the last iteration could be 2 ( if diag selected) 1/4 pel
  if (forced_stop < HALF_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  if (allow_hp && forced_stop == EIGHTH_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  return besterr;
}